

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rb_aug.c
# Opt level: O1

wtree_node_t * wtree_walk_next(wtree_walk *it,int dir,wtree_node_t **r_left,wtree_node_t **r_right)

{
  int *piVar1;
  wtree_node_t *pwVar2;
  int iVar3;
  long lVar4;
  wtree_node_t *pwVar5;
  uint uVar6;
  ulong uVar7;
  wtree_node_t *pwVar8;
  uint uVar9;
  int *piVar10;
  
  lVar4 = (long)it->count;
  if (lVar4 == 0) {
    pwVar5 = it->path[0].node;
    if (pwVar5 == (wtree_node_t *)0x0) {
      return (wtree_node_t *)0x0;
    }
    it->count = 1;
  }
  else {
    pwVar2 = it->path[lVar4 + -1].node;
    it->path[lVar4 + -1].dir = dir;
    if ((((dir & 1U) == 0) || (pwVar5 = (pwVar2->in_tree).rbn_left, pwVar5 == (wtree_node_t *)0x0))
       && (((dir & 2U) == 0 ||
           (pwVar5 = (wtree_node_t *)((ulong)(pwVar2->in_tree).rbn_right_red & 0xfffffffffffffffe),
           pwVar5 == (wtree_node_t *)0x0)))) {
      uVar6 = it->count;
      uVar7 = (ulong)uVar6;
      uVar9 = 1;
      if ((int)uVar6 < 1) {
        uVar9 = uVar6;
      }
      piVar10 = &it->path[uVar7 - 2].dir;
      do {
        pwVar8 = pwVar2;
        pwVar5 = pwVar8;
        uVar6 = uVar9 - 1;
        if ((int)uVar7 < 2) break;
        pwVar2 = ((anon_struct_16_2_62ea00d6 *)(piVar10 + -2))->node;
        uVar6 = (int)uVar7 - 1;
        uVar7 = (ulong)uVar6;
        piVar1 = piVar10 + -4;
        iVar3 = *piVar10;
        piVar10 = piVar1;
      } while ((((iVar3 & 2) == 0) ||
               (pwVar5 = (wtree_node_t *)
                         ((ulong)(pwVar2->in_tree).rbn_right_red & 0xfffffffffffffffe),
               pwVar5 == (wtree_node_t *)0x0)) || (pwVar8 == pwVar5));
      it->count = uVar6;
      if (uVar6 == 0) {
        return (wtree_node_t *)0x0;
      }
    }
    iVar3 = it->count;
    it->count = iVar3 + 1;
    it->path[iVar3].node = pwVar5;
  }
  *r_left = (pwVar5->in_tree).rbn_left;
  *r_right = (wtree_node_t *)((ulong)(pwVar5->in_tree).rbn_right_red & 0xfffffffffffffffe);
  return pwVar5;
}

Assistant:

static void
wtree_selfcheck(wtree_t *tree)
{
	wtree_node_t *node, *prev, *left, *right;

	/* Check node order. */
	struct wtree_iterator it;
	wtree_ifirst(tree, &it);
	prev = NULL;
	while ((node = wtree_inext(&it)) != NULL) {
		if (prev != NULL)
			fail_unless(prev->value <= node->value);
		prev = node;
	}

	/* Check node weights. */
	struct wtree_walk walk;
	wtree_walk_init(&walk, tree);
	while ((node = wtree_walk_next(&walk, RB_WALK_RIGHT | RB_WALK_LEFT,
				       &left, &right)) != NULL) {
		int left_weight = left != NULL ? left->weight : 0;
		int right_weight = right != NULL ? right->weight : 0;
		fail_unless(node->weight == left_weight + right_weight + 1);
	}
}